

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriterState<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::
StandardColumnWriterState
          (StandardColumnWriterState<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *this,
          ParquetWriter *writer,RowGroup *row_group,idx_t col_idx)

{
  RowGroup *in_RCX;
  ParquetWriter *in_RDX;
  ParquetWriter *in_RSI;
  Allocator *in_RDI;
  PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *unaff_retaddr;
  ClientContext *in_stack_ffffffffffffffb0;
  idx_t in_stack_ffffffffffffffd8;
  Allocator *allocator_p;
  
  allocator_p = in_RDI;
  PrimitiveColumnWriterState::PrimitiveColumnWriterState
            ((PrimitiveColumnWriterState *)in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  in_RDI->allocate_function = (allocate_function_ptr_t)&PTR__StandardColumnWriterState_03546c30;
  in_RDI[6].reallocate_function = (reallocate_function_ptr_t)0x0;
  in_RDI[6].private_data.
  super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
  .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl =
       (PrivateAllocatorData *)0x0;
  *(undefined4 *)&in_RDI[7].allocate_function = 0;
  ParquetWriter::GetContext(in_RSI);
  BufferAllocator::Get(in_stack_ffffffffffffffb0);
  ParquetWriter::DictionarySizeLimit(in_RSI);
  ParquetWriter::StringDictionaryPageSizeLimit(in_RSI);
  PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::PrimitiveDictionary
            (unaff_retaddr,allocator_p,(idx_t)in_RSI,(idx_t)in_RDX);
  *(undefined4 *)&in_RDI[0xc].free_function = 0;
  return;
}

Assistant:

StandardColumnWriterState(ParquetWriter &writer, duckdb_parquet::RowGroup &row_group, idx_t col_idx)
	    : PrimitiveColumnWriterState(writer, row_group, col_idx),
	      dictionary(BufferAllocator::Get(writer.GetContext()), writer.DictionarySizeLimit(),
	                 writer.StringDictionaryPageSizeLimit()),
	      encoding(duckdb_parquet::Encoding::PLAIN) {
	}